

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

handle pybind11::detail::tuple_caster<std::pair,long,long>::cast_impl<std::pair<long,long>&,0ul,1ul>
                 (undefined8 *src)

{
  undefined8 uVar1;
  long lVar2;
  handle hVar3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  object local_30 [2];
  handle local_20;
  
  local_30[0].super_handle.m_ptr = (handle)PyLong_FromSsize_t(*src);
  local_30[1].super_handle.m_ptr = (handle)PyLong_FromSsize_t(src[1]);
  hVar3.m_ptr = (PyObject *)0x0;
  lVar2 = 0;
  do {
    if (*(long *)((long)&local_30[0].super_handle.m_ptr + lVar2) == 0) goto LAB_001b68da;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  tuple::tuple((tuple *)&local_20,2);
  hVar3.m_ptr = local_20.m_ptr;
  lVar2 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&local_30[0].super_handle.m_ptr + lVar2);
    *(undefined8 *)((long)&local_30[0].super_handle.m_ptr + lVar2) = 0;
    *(undefined8 *)((long)&local_20.m_ptr[1].ob_type + lVar2) = uVar1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  local_20.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_20);
LAB_001b68da:
  lVar2 = 8;
  do {
    object::~object((object *)((long)&local_30[0].super_handle.m_ptr + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }